

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UBool __thiscall
icu_63::UnicodeString::cloneArrayIfNeeded
          (UnicodeString *this,int32_t newCapacity,int32_t growCapacity,UBool doCopyArray,
          int32_t **pBufferToDelete,UBool forceClone)

{
  UChar *pUVar1;
  ushort uVar2;
  ushort uVar3;
  UBool UVar4;
  UChar *__dest;
  int iVar5;
  char16_t *__dest_00;
  int32_t len;
  int32_t capacity;
  UChar oldStackBuffer [27];
  
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar2 & 2) == 0) {
    capacity = (this->fUnion).fFields.fCapacity;
  }
  else {
    capacity = 0x1b;
  }
  if (newCapacity != -1) {
    capacity = newCapacity;
  }
  if ((uVar2 & 0x11) != 0) {
    return '\0';
  }
  if ((forceClone == '\0') && ((uVar2 & 8) == 0)) {
    if ((uVar2 & 4) != 0) {
      if (1 < *(int *)((this->fUnion).fFields.fArray + -2)) goto LAB_002b5d3e;
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
    }
    if ((uVar2 & 2) == 0) {
      iVar5 = (this->fUnion).fFields.fCapacity;
    }
    else {
      iVar5 = 0x1b;
    }
    if (capacity <= iVar5) {
      return '\x01';
    }
  }
LAB_002b5d3e:
  iVar5 = capacity;
  if (-1 < growCapacity) {
    iVar5 = 0x1b;
    if ((uint)growCapacity < 0x1b) {
      iVar5 = growCapacity;
    }
    if (0x1b < capacity) {
      iVar5 = growCapacity;
    }
  }
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar2 < 0) {
    len = (this->fUnion).fFields.fLength;
  }
  else {
    len = (int)(short)uVar2 >> 5;
  }
  if (((int)(short)uVar2 & 2U) == 0) {
    __dest = (this->fUnion).fFields.fArray;
  }
  else {
    __dest = (UChar *)0x0;
    if ((doCopyArray != '\0') && (0x1b < iVar5)) {
      if (len < 1) {
        __dest = oldStackBuffer;
      }
      else {
        __dest = oldStackBuffer;
        memcpy(__dest,(void *)((long)&this->fUnion + 2),(ulong)(uint)(len * 2));
      }
    }
  }
  UVar4 = allocate(this,iVar5);
  if ((UVar4 == '\0') && ((iVar5 <= capacity || (UVar4 = allocate(this,capacity), UVar4 == '\0'))))
  {
    if ((uVar2 & 2) == 0) {
      (this->fUnion).fFields.fArray = __dest;
    }
    (this->fUnion).fStackFields.fLengthAndFlags = uVar2;
    setToBogus(this);
    return '\0';
  }
  uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (doCopyArray == '\0') {
    (this->fUnion).fStackFields.fLengthAndFlags = uVar3 & 0x1f;
  }
  else {
    if ((uVar3 & 2) == 0) {
      iVar5 = (this->fUnion).fFields.fCapacity;
    }
    else {
      iVar5 = 0x1b;
    }
    if (iVar5 < len) {
      len = iVar5;
    }
    if ((__dest != (UChar *)0x0) && (0 < len)) {
      if ((uVar3 & 2) == 0) {
        __dest_00 = (this->fUnion).fFields.fArray;
      }
      else {
        __dest_00 = (char16_t *)((long)&this->fUnion + 2);
      }
      memmove(__dest_00,__dest,(ulong)(uint)(len * 2));
    }
    setLength(this,len);
  }
  if ((uVar2 & 4) != 0) {
    LOCK();
    pUVar1 = __dest + -2;
    *(int *)pUVar1 = *(int *)pUVar1 + -1;
    UNLOCK();
    if (*(int *)pUVar1 == 0) {
      if (pBufferToDelete == (int32_t **)0x0) {
        uprv_free_63(__dest + -2);
      }
      else {
        *pBufferToDelete = (int32_t *)(__dest + -2);
      }
    }
  }
  return '\x01';
}

Assistant:

UBool
UnicodeString::cloneArrayIfNeeded(int32_t newCapacity,
                                  int32_t growCapacity,
                                  UBool doCopyArray,
                                  int32_t **pBufferToDelete,
                                  UBool forceClone) {
  // default parameters need to be static, therefore
  // the defaults are -1 to have convenience defaults
  if(newCapacity == -1) {
    newCapacity = getCapacity();
  }

  // while a getBuffer(minCapacity) is "open",
  // prevent any modifications of the string by returning FALSE here
  // if the string is bogus, then only an assignment or similar can revive it
  if(!isWritable()) {
    return FALSE;
  }

  /*
   * We need to make a copy of the array if
   * the buffer is read-only, or
   * the buffer is refCounted (shared), and refCount>1, or
   * the buffer is too small.
   * Return FALSE if memory could not be allocated.
   */
  if(forceClone ||
     fUnion.fFields.fLengthAndFlags & kBufferIsReadonly ||
     (fUnion.fFields.fLengthAndFlags & kRefCounted && refCount() > 1) ||
     newCapacity > getCapacity()
  ) {
    // check growCapacity for default value and use of the stack buffer
    if(growCapacity < 0) {
      growCapacity = newCapacity;
    } else if(newCapacity <= US_STACKBUF_SIZE && growCapacity > US_STACKBUF_SIZE) {
      growCapacity = US_STACKBUF_SIZE;
    }

    // save old values
    UChar oldStackBuffer[US_STACKBUF_SIZE];
    UChar *oldArray;
    int32_t oldLength = length();
    int16_t flags = fUnion.fFields.fLengthAndFlags;

    if(flags&kUsingStackBuffer) {
      U_ASSERT(!(flags&kRefCounted)); /* kRefCounted and kUsingStackBuffer are mutally exclusive */
      if(doCopyArray && growCapacity > US_STACKBUF_SIZE) {
        // copy the stack buffer contents because it will be overwritten with
        // fUnion.fFields values
        us_arrayCopy(fUnion.fStackFields.fBuffer, 0, oldStackBuffer, 0, oldLength);
        oldArray = oldStackBuffer;
      } else {
        oldArray = NULL; // no need to copy from the stack buffer to itself
      }
    } else {
      oldArray = fUnion.fFields.fArray;
      U_ASSERT(oldArray!=NULL); /* when stack buffer is not used, oldArray must have a non-NULL reference */
    }

    // allocate a new array
    if(allocate(growCapacity) ||
       (newCapacity < growCapacity && allocate(newCapacity))
    ) {
      if(doCopyArray) {
        // copy the contents
        // do not copy more than what fits - it may be smaller than before
        int32_t minLength = oldLength;
        newCapacity = getCapacity();
        if(newCapacity < minLength) {
          minLength = newCapacity;
        }
        if(oldArray != NULL) {
          us_arrayCopy(oldArray, 0, getArrayStart(), 0, minLength);
        }
        setLength(minLength);
      } else {
        setZeroLength();
      }

      // release the old array
      if(flags & kRefCounted) {
        // the array is refCounted; decrement and release if 0
        u_atomic_int32_t *pRefCount = ((u_atomic_int32_t *)oldArray - 1);
        if(umtx_atomic_dec(pRefCount) == 0) {
          if(pBufferToDelete == 0) {
              // Note: cast to (void *) is needed with MSVC, where u_atomic_int32_t
              // is defined as volatile. (Volatile has useful non-standard behavior
              //   with this compiler.)
            uprv_free((void *)pRefCount);
          } else {
            // the caller requested to delete it himself
            *pBufferToDelete = (int32_t *)pRefCount;
          }
        }
      }
    } else {
      // not enough memory for growCapacity and not even for the smaller newCapacity
      // reset the old values for setToBogus() to release the array
      if(!(flags&kUsingStackBuffer)) {
        fUnion.fFields.fArray = oldArray;
      }
      fUnion.fFields.fLengthAndFlags = flags;
      setToBogus();
      return FALSE;
    }
  }
  return TRUE;
}